

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# termination_test.c
# Opt level: O0

void simple_test(int converter)

{
  int error_00;
  char *pcVar1;
  undefined1 auStack_c35d0 [8];
  SRC_DATA src_data;
  double ratio;
  float out [1000];
  float in [199030];
  int error;
  int converter_local;
  
  src_data.src_ratio = 0.005024368185700648;
  auStack_c35d0 = (undefined1  [8])(out + 0x3e6);
  src_data.data_in = (float *)&ratio;
  src_data.data_out = (float *)0x30976;
  src_data.input_frames = 1000;
  src_data.output_frames = 0;
  src_data.input_frames_used = 0;
  src_data.output_frames_gen._0_4_ = 0;
  src_data.end_of_input = -0x6f598263;
  src_data._52_4_ = 0x3f74946e;
  error_00 = src_simple((SRC_DATA *)auStack_c35d0,converter,1);
  if (error_00 != 0) {
    pcVar1 = src_strerror(error_00);
    printf("\n\nLine %d : %s\n\n",0x60,pcVar1);
    exit(1);
  }
  return;
}

Assistant:

static void
simple_test (int converter)
{
	// MSVC doesn't support variable-length arrays
	#define ilen 199030
	#define olen 1000
	int error ;

	{
		float in [ilen] ;
		float out [olen] ;
		double ratio = (1.0 * olen) / ilen ;
		SRC_DATA src_data =
		{	in, out,
			ilen, olen,
			0, 0, 0,
			ratio
		} ;

		error = src_simple (&src_data, converter, 1) ;
		if (error)
		{	printf ("\n\nLine %d : %s\n\n", __LINE__, src_strerror (error)) ;
			exit (1) ;
			} ;
	} ;

    return ;
}